

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleAbstractScrollArea::child(QAccessibleAbstractScrollArea *this,int index)

{
  QAccessibleInterface *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  accessibleChildren((QWidgetList *)&local_30,this);
  pQVar1 = (QAccessibleInterface *)
           QAccessible::queryAccessibleInterface(&local_30.ptr[index]->super_QObject);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleAbstractScrollArea::child(int index) const
{
    return QAccessible::queryAccessibleInterface(accessibleChildren().at(index));
}